

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joysticks.c
# Opt level: O0

void joystick_callback(int jid,int event)

{
  int iVar1;
  long lVar2;
  int local_14;
  int i;
  int event_local;
  int jid_local;
  
  if (event == 0x40001) {
    lVar2 = (long)joystick_count;
    joystick_count = joystick_count + 1;
    joysticks[lVar2] = jid;
  }
  else if (event == 0x40002) {
    for (local_14 = 0; (iVar1 = local_14, local_14 < joystick_count && (joysticks[local_14] != jid))
        ; local_14 = local_14 + 1) {
    }
    while (local_14 = iVar1 + 1, local_14 < joystick_count) {
      joysticks[iVar1] = joysticks[local_14];
      iVar1 = local_14;
    }
    joystick_count = joystick_count + -1;
  }
  iVar1 = glfwGetWindowAttrib(window,0x20001);
  if (iVar1 == 0) {
    glfwRequestWindowAttention(window);
  }
  return;
}

Assistant:

static void joystick_callback(int jid, int event)
{
    if (event == GLFW_CONNECTED)
        joysticks[joystick_count++] = jid;
    else if (event == GLFW_DISCONNECTED)
    {
        int i;

        for (i = 0;  i < joystick_count;  i++)
        {
            if (joysticks[i] == jid)
                break;
        }

        for (i = i + 1;  i < joystick_count;  i++)
            joysticks[i - 1] = joysticks[i];

        joystick_count--;
    }

    if (!glfwGetWindowAttrib(window, GLFW_FOCUSED))
        glfwRequestWindowAttention(window);
}